

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  float x2_00;
  float y2_00;
  float fVar1;
  float fVar2;
  float x3_00;
  float y3_00;
  float x3_01;
  float y3_01;
  float x4_00;
  float y4_00;
  float local_84;
  float local_80;
  float y1234;
  float x1234;
  float y234;
  float x234;
  float y123;
  float x123;
  float y34;
  float x34;
  float y23;
  float x23;
  float y12;
  float x12;
  float local_44;
  float local_40;
  float d3;
  float d2;
  float dy;
  float dx;
  int level_local;
  float y4_local;
  float x4_local;
  float y3_local;
  float x3_local;
  float y2_local;
  float x2_local;
  float y1_local;
  float x1_local;
  ImVector<ImVec2> *path_local;
  
  d2 = x4 - x1;
  d3 = y4 - y1;
  local_80 = (x2 - x4) * d3 + -((y2 - y4) * d2);
  local_84 = (x3 - x4) * d3 + -((y3 - y4) * d2);
  if (local_80 < 0.0) {
    local_80 = -local_80;
  }
  local_40 = local_80;
  if (local_84 < 0.0) {
    local_84 = -local_84;
  }
  local_44 = local_84;
  dy = (float)level;
  dx = y4;
  level_local = (int)x4;
  y4_local = y3;
  x4_local = x3;
  y3_local = y2;
  x3_local = x2;
  y2_local = y1;
  x2_local = x1;
  _y1_local = path;
  if (tess_tol * (d2 * d2 + d3 * d3) <= (local_80 + local_84) * (local_80 + local_84)) {
    if (level < 10) {
      x2_00 = (x1 + x2) * 0.5;
      y2_00 = (y1 + y2) * 0.5;
      fVar1 = (x2 + x3) * 0.5;
      fVar2 = (y2 + y3) * 0.5;
      x3_00 = (x3 + x4) * 0.5;
      y3_00 = (y3 + y4) * 0.5;
      x3_01 = (x2_00 + fVar1) * 0.5;
      y3_01 = (y2_00 + fVar2) * 0.5;
      fVar1 = (fVar1 + x3_00) * 0.5;
      fVar2 = (fVar2 + y3_00) * 0.5;
      x4_00 = (x3_01 + fVar1) * 0.5;
      y4_00 = (y3_01 + fVar2) * 0.5;
      PathBezierToCasteljau(path,x1,y1,x2_00,y2_00,x3_01,y3_01,x4_00,y4_00,tess_tol,level + 1);
      PathBezierToCasteljau
                (_y1_local,x4_00,y4_00,fVar1,fVar2,x3_00,y3_00,(float)level_local,dx,tess_tol,
                 (int)dy + 1);
    }
  }
  else {
    ImVec2::ImVec2((ImVec2 *)&y12,x4,y4);
    ImVector<ImVec2>::push_back(path,(ImVec2 *)&y12);
  }
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2+d3) * (d2+d3) < tess_tol * (dx*dx + dy*dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1+x2)*0.5f,       y12 = (y1+y2)*0.5f;
        float x23 = (x2+x3)*0.5f,       y23 = (y2+y3)*0.5f;
        float x34 = (x3+x4)*0.5f,       y34 = (y3+y4)*0.5f;
        float x123 = (x12+x23)*0.5f,    y123 = (y12+y23)*0.5f;
        float x234 = (x23+x34)*0.5f,    y234 = (y23+y34)*0.5f;
        float x1234 = (x123+x234)*0.5f, y1234 = (y123+y234)*0.5f;

        PathBezierToCasteljau(path, x1,y1,        x12,y12,    x123,y123,  x1234,y1234, tess_tol, level+1);
        PathBezierToCasteljau(path, x1234,y1234,  x234,y234,  x34,y34,    x4,y4,       tess_tol, level+1);
    }
}